

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrameMoving.h
# Opt level: O2

ChVector<double> * __thiscall
chrono::ChFrameMoving<double>::GetWacc_loc
          (ChVector<double> *__return_storage_ptr__,ChFrameMoving<double> *this)

{
  ChGlMatrix34<double> Gl;
  ChGlMatrix34<double> CStack_a0;
  
  ChGlMatrix34<double>::ChGlMatrix34(&CStack_a0,&(this->super_ChFrame<double>).coord.rot);
  chrono::operator*(&CStack_a0.super_ChMatrix34<double>,&(this->coord_dtdt).rot);
  return __return_storage_ptr__;
}

Assistant:

ChVector<Real> GetWacc_loc() const {
        ChGlMatrix34<> Gl(this->coord.rot);
        return Gl * coord_dtdt.rot;
    }